

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dic_compiler.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  char text [4096];
  
  if (argc < 2) {
    fprintf(_stderr,"Usage: %s dictionary.dic\n",*argv);
    iVar1 = -1;
  }
  else {
    while( true ) {
      iVar1 = feof(_stdin);
      __stream = _stdin;
      if (iVar1 != 0) break;
      iVar1 = ferror(_stdin);
      if (iVar1 != 0) break;
      pcVar2 = fgets(text,0x1000,__stream);
      if (pcVar2 == (char *)0x0) break;
      sVar3 = strcspn(text,"\r\n");
      text[sVar3] = '\0';
      sVar3 = strcspn(text,"\t");
      text[sVar3] = '\0';
      uVar4 = strtoul(text + sVar3 + 1,(char **)0x0,10);
      dic_insert_word(text,(uint)uVar4);
    }
    MAFSA::daciuk<29>::save_to_file(&dict,argv[1]);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main(int argc, char **argv)
{
	if (2 > argc)
	{
		fprintf(stderr, "Usage: %s dictionary.dic\n", argv[0]);
		return -1;
	}

	while (!feof(stdin) && !ferror(stdin))
	{
		char text [4096];
		size_t size, tabs;

		if (NULL == fgets(text, 4096, stdin))
		{
			break;
		}

		size = strcspn(text, "\r\n");
		text[size] = 0;

		tabs = strcspn(text, "\t");
		text[tabs] = 0;

		dic_insert_word(text, strtoul(text + tabs + 1, NULL, 10));
	}

	dict.save_to_file(argv[1]);

	return 0;
}